

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccpath.cpp
# Opt level: O3

CCDir * gnuc64(void)

{
  CCDir *in_RDI;
  
  (in_RDI->include_path)._M_dataplus._M_p = (pointer)&(in_RDI->include_path).field_2;
  (in_RDI->include_path)._M_string_length = 0;
  (in_RDI->include_path).field_2._M_local_buf[0] = '\0';
  (in_RDI->lib86_path)._M_dataplus._M_p = (pointer)&(in_RDI->lib86_path).field_2;
  (in_RDI->lib86_path)._M_string_length = 0;
  (in_RDI->lib86_path).field_2._M_local_buf[0] = '\0';
  (in_RDI->lib64_path)._M_dataplus._M_p = (pointer)&(in_RDI->lib64_path).field_2;
  (in_RDI->lib64_path)._M_string_length = 0;
  (in_RDI->lib64_path).field_2._M_local_buf[0] = '\0';
  (in_RDI->dll86_path)._M_dataplus._M_p = (pointer)&(in_RDI->dll86_path).field_2;
  (in_RDI->dll86_path)._M_string_length = 0;
  (in_RDI->dll86_path).field_2._M_local_buf[0] = '\0';
  (in_RDI->dll64_path)._M_dataplus._M_p = (pointer)&(in_RDI->dll64_path).field_2;
  (in_RDI->dll64_path)._M_string_length = 0;
  (in_RDI->dll64_path).field_2._M_local_buf[0] = '\0';
  (in_RDI->compiler_path)._M_dataplus._M_p = (pointer)&(in_RDI->compiler_path).field_2;
  (in_RDI->compiler_path)._M_string_length = 0;
  (in_RDI->compiler_path).field_2._M_local_buf[0] = '\0';
  (in_RDI->compiler_name)._M_dataplus._M_p = (pointer)&(in_RDI->compiler_name).field_2;
  (in_RDI->compiler_name)._M_string_length = 0;
  (in_RDI->compiler_name).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_replace((ulong)in_RDI,0,(char *)0x0,0x13e260);
  std::__cxx11::string::_M_replace
            ((ulong)&in_RDI->lib64_path,0,(char *)(in_RDI->lib64_path)._M_string_length,0x13e26e);
  std::__cxx11::string::_M_replace
            ((ulong)&in_RDI->dll64_path,0,(char *)(in_RDI->dll64_path)._M_string_length,0x13e26e);
  std::__cxx11::string::_M_replace
            ((ulong)&in_RDI->compiler_path,0,(char *)(in_RDI->compiler_path)._M_string_length,
             0x13e289);
  std::__cxx11::string::_M_replace
            ((ulong)&in_RDI->compiler_name,0,(char *)(in_RDI->compiler_name)._M_string_length,
             0x13d0a5);
  return in_RDI;
}

Assistant:

CCDir gnuc64() {
    CCDir dir;
    dir.include_path="/usr/include/";
    dir.lib64_path="/usr/lib/x86_64-linux-gnu/";
    dir.dll64_path="/usr/lib/x86_64-linux-gnu/";
    dir.compiler_path="/usr/";
    dir.compiler_name = "gnuc";
    return dir;
}